

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void split_partition_search
               (AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,TokenExtra **tp,
               MACROBLOCK *x,PC_TREE *pc_tree,SIMPLE_MOTION_DATA_TREE *sms_tree,
               RD_SEARCH_MACROBLOCK_CONTEXT *x_ctx,PartitionSearchState *part_search_state,
               RD_STATS *best_rdc,SB_MULTI_PASS_MODE multi_pass_mode,int64_t *part_split_rd)

{
  long lVar1;
  bool bVar2;
  BLOCK_SIZE BVar3;
  _Bool _Var4;
  int iVar5;
  PC_TREE *pPVar6;
  long in_RDI;
  long in_R8;
  undefined1 *in_R9;
  undefined8 *in_stack_00000018;
  void *in_stack_00000020;
  long *in_stack_00000030;
  int partition_none_better;
  int partition_none_valid;
  int reached_last_index;
  PALETTE_MODE_INFO *pmi;
  MB_MODE_INFO *mbmi;
  SIMPLE_MOTION_DATA_TREE *sms_tree_split;
  int curr_quad_tree_idx;
  RD_STATS best_remain_rdcost;
  int64_t *p_split_rd;
  int y_idx;
  int x_idx;
  int idx;
  int i;
  BLOCK_SIZE subsize;
  RD_STATS sum_rdc;
  BLOCK_SIZE bsize;
  int mi_col;
  int mi_row;
  CommonModeInfoParams *mi_params;
  PartitionBlkParams blk_params;
  AV1_COMMON *cm;
  int in_stack_000001c8;
  int in_stack_000001cc;
  TokenExtra **in_stack_000001d0;
  TileDataEnc *in_stack_000001d8;
  ThreadData_conflict *in_stack_000001e0;
  AV1_COMP *in_stack_000001e8;
  BLOCK_SIZE in_stack_00000220;
  RD_STATS *in_stack_00000228;
  RD_STATS in_stack_00000230;
  PC_TREE *in_stack_00000258;
  SIMPLE_MOTION_DATA_TREE *in_stack_00000260;
  int64_t *in_stack_00000268;
  SB_MULTI_PASS_MODE in_stack_00000270;
  RD_RECT_PART_WIN_INFO *in_stack_00000278;
  uint in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  RD_STATS *in_stack_fffffffffffffe20;
  RD_STATS *in_stack_fffffffffffffe28;
  long in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  RD_SEARCH_MACROBLOCK_CONTEXT *in_stack_fffffffffffffe48;
  MACROBLOCK *in_stack_fffffffffffffe50;
  bool local_161;
  int local_124;
  RD_STATS *in_stack_fffffffffffffee0;
  uint in_stack_fffffffffffffeec;
  undefined8 in_stack_fffffffffffffef0;
  undefined8 uStack_108;
  RD_SEARCH_MACROBLOCK_CONTEXT *local_100;
  uint local_e4;
  int local_e0;
  RD_STATS local_d8;
  BLOCK_SIZE local_a9;
  int local_a8;
  int local_a4;
  CommonModeInfoParams *local_a0;
  int local_94;
  int local_90;
  int local_8c;
  BLOCK_SIZE local_6c;
  AV1_COMMON *local_68;
  undefined1 *local_60;
  long local_58;
  long local_38;
  
  local_68 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  local_60 = in_R9;
  local_58 = in_R8;
  local_38 = in_RDI;
  memcpy(&local_94,in_stack_00000018 + 1,0x2c);
  local_a0 = &local_68->mi_params;
  local_a4 = local_90;
  local_a8 = local_8c;
  local_a9 = local_6c;
  memcpy(&local_d8,in_stack_00000018 + 0x10,0x28);
  BVar3 = get_partition_subsize
                    ((BLOCK_SIZE)((ulong)in_stack_fffffffffffffe20 >> 0x30),
                     (PARTITION_TYPE)((ulong)in_stack_fffffffffffffe20 >> 0x28));
  if ((*(int *)(in_stack_00000018 + 0x23) != 0) || (*(int *)((long)in_stack_00000018 + 300) == 0)) {
    return;
  }
  for (local_e0 = 0; local_e0 < 4; local_e0 = local_e0 + 1) {
    if (*(long *)(local_60 + (long)local_e0 * 8 + 0xd0) == 0) {
      pPVar6 = av1_alloc_pc_tree_node((BLOCK_SIZE)((uint)in_stack_fffffffffffffe1c >> 0x18));
      *(PC_TREE **)(local_60 + (long)local_e0 * 8 + 0xd0) = pPVar6;
    }
    if (*(long *)(local_60 + (long)local_e0 * 8 + 0xd0) == 0) {
      aom_internal_error(*(aom_internal_error_info **)(local_58 + 0x2b90),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PC_TREE");
    }
    *(int *)(*(long *)(local_60 + (long)local_e0 * 8 + 0xd0) + 0xf0) = local_e0;
  }
  av1_init_rd_stats(&local_d8);
  local_d8.rate = *(int *)(in_stack_00000018[0x17] + 0xc);
  local_d8.rdcost = (long)local_d8.rate * (long)*(int *)(local_58 + 0x4218) + 0x100 >> 9;
  local_e4 = 0;
  do {
    bVar2 = false;
    if ((int)local_e4 < 4) {
      bVar2 = local_d8.rdcost < *(long *)((long)in_stack_00000020 + 0x10);
    }
    if (!bVar2) goto LAB_0027f15f;
    if ((local_a4 + ((int)local_e4 >> 1) * local_94 < local_a0->mi_rows) &&
       ((int)(local_a8 + (local_e4 & 1) * local_94) < local_a0->mi_cols)) {
      *(uint *)(*(long *)(local_60 + (long)(int)local_e4 * 8 + 0xd0) + 0xf0) = local_e4;
      av1_rd_stats_subtraction
                ((int)((ulong)in_stack_fffffffffffffe30 >> 0x20),in_stack_fffffffffffffe28,
                 in_stack_fffffffffffffe20,
                 (RD_STATS *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      local_124 = 0;
      in_stack_fffffffffffffe28 = in_stack_fffffffffffffee0;
      in_stack_fffffffffffffe38 = in_stack_fffffffffffffef0;
      iVar5 = frame_is_intra_only(local_68);
      if ((iVar5 != 0) && (local_a9 < BLOCK_64X128)) {
        local_124 = *(int *)*in_stack_00000018;
        *(uint *)*in_stack_00000018 = local_124 * 4 + local_e4 + 1;
      }
      in_stack_fffffffffffffe20 = (RD_STATS *)(in_stack_00000018 + 0xb);
      in_stack_fffffffffffffe50 = *(MACROBLOCK **)(local_60 + (long)(int)local_e4 * 8 + 0xd0);
      in_stack_fffffffffffffe30 = (ulong)in_stack_fffffffffffffeec << 0x20;
      in_stack_fffffffffffffe18 = (uint)BVar3;
      in_stack_fffffffffffffe40 = uStack_108;
      in_stack_fffffffffffffe48 = local_100;
      in_stack_fffffffffffffee0 = in_stack_fffffffffffffe28;
      in_stack_fffffffffffffef0 = in_stack_fffffffffffffe38;
      _Var4 = av1_rd_pick_partition
                        (in_stack_000001e8,in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,
                         in_stack_000001cc,in_stack_000001c8,in_stack_00000220,in_stack_00000228,
                         in_stack_00000230,in_stack_00000258,in_stack_00000260,in_stack_00000268,
                         in_stack_00000270,in_stack_00000278);
      if (!_Var4) {
        av1_invalid_rd_stats(&local_d8);
LAB_0027f15f:
        *in_stack_00000030 = local_d8.rdcost;
        if ((local_e4 == 4) && (local_d8.rdcost < *(long *)((long)in_stack_00000020 + 0x10))) {
          local_d8.rdcost =
               ((long)local_d8.rate * (long)*(int *)(local_58 + 0x4218) + 0x100 >> 9) +
               local_d8.dist * 0x80;
          if (local_d8.rdcost < *(long *)((long)in_stack_00000020 + 0x10)) {
            memcpy(in_stack_00000020,&local_d8,0x28);
            *(undefined1 *)((long)in_stack_00000018 + 0x144) = 1;
            *local_60 = 3;
          }
        }
        else if ((0 < *(int *)(local_38 + 0x60964)) &&
                ((*(int *)(local_38 + 0x60964) == 2 || ((int)local_e4 < 3)))) {
          local_161 = 0 < (long)in_stack_00000018[0x18] &&
                      (long)in_stack_00000018[0x18] < local_d8.rdcost;
          *(uint *)(in_stack_00000018 + 0x25) =
               (uint)((local_161 ^ 0xffU) & 1) & *(uint *)(in_stack_00000018 + 0x25);
        }
        if ((*(BLOCK_SIZE *)(local_58 + 0x15251) < local_a9) &&
           (local_a9 != local_68->seq_params->sb_size)) {
          return;
        }
        av1_num_planes(local_68);
        av1_restore_context(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                            (int)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                            (int)in_stack_fffffffffffffe40,
                            (BLOCK_SIZE)((ulong)in_stack_fffffffffffffe38 >> 0x38),
                            (int)in_stack_fffffffffffffe38);
        return;
      }
      iVar5 = frame_is_intra_only(local_68);
      if ((iVar5 != 0) && (local_a9 < BLOCK_64X128)) {
        *(int *)*in_stack_00000018 = local_124;
      }
      local_d8.rate = *(int *)(in_stack_00000018 + 0xb) + local_d8.rate;
      local_d8.dist = in_stack_00000018[0xc] + local_d8.dist;
      av1_rd_cost_update((int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                         (RD_STATS *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      if ((((int)local_e4 < 2) &&
          (((local_a9 < BLOCK_8X16 ||
            (**(char **)(local_60 + (long)(int)local_e4 * 8 + 0xd0) == '\0')) &&
           (lVar1 = *(long *)(*(long *)(local_60 + (long)(int)local_e4 * 8 + 0xd0) + 8),
           *(char *)(lVar1 + 0x8e) == '\0')))) &&
         ((*(char *)(lVar1 + 0x8f) == '\0' && (*(char *)(lVar1 + 3) != '\r')))) {
        *(undefined4 *)((long)in_stack_00000018 + (long)(int)local_e4 * 4 + 0x108) = 1;
      }
    }
    local_e4 = local_e4 + 1;
  } while( true );
}

Assistant:

static void split_partition_search(
    AV1_COMP *const cpi, ThreadData *td, TileDataEnc *tile_data,
    TokenExtra **tp, MACROBLOCK *x, PC_TREE *pc_tree,
    SIMPLE_MOTION_DATA_TREE *sms_tree, RD_SEARCH_MACROBLOCK_CONTEXT *x_ctx,
    PartitionSearchState *part_search_state, RD_STATS *best_rdc,
    SB_MULTI_PASS_MODE multi_pass_mode, int64_t *part_split_rd) {
  const AV1_COMMON *const cm = &cpi->common;
  PartitionBlkParams blk_params = part_search_state->part_blk_params;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int mi_row = blk_params.mi_row;
  const int mi_col = blk_params.mi_col;
  const BLOCK_SIZE bsize = blk_params.bsize;
  assert(bsize < BLOCK_SIZES_ALL);
  RD_STATS sum_rdc = part_search_state->sum_rdc;
  const BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_SPLIT);

  // Check if partition split is allowed.
  if (part_search_state->terminate_partition_search ||
      !part_search_state->do_square_split)
    return;

  for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
    if (pc_tree->split[i] == NULL)
      pc_tree->split[i] = av1_alloc_pc_tree_node(subsize);
    if (!pc_tree->split[i])
      aom_internal_error(x->e_mbd.error_info, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PC_TREE");
    pc_tree->split[i]->index = i;
  }

  // Initialization of this partition RD stats.
  av1_init_rd_stats(&sum_rdc);
  sum_rdc.rate = part_search_state->partition_cost[PARTITION_SPLIT];
  sum_rdc.rdcost = RDCOST(x->rdmult, sum_rdc.rate, 0);

  int idx;
#if CONFIG_COLLECT_PARTITION_STATS
  PartitionTimingStats *part_timing_stats =
      &part_search_state->part_timing_stats;
  if (best_rdc->rdcost - sum_rdc.rdcost >= 0) {
    start_partition_block_timer(part_timing_stats, PARTITION_SPLIT);
  }
#endif
  // Recursive partition search on 4 sub-blocks.
  for (idx = 0; idx < SUB_PARTITIONS_SPLIT && sum_rdc.rdcost < best_rdc->rdcost;
       ++idx) {
    const int x_idx = (idx & 1) * blk_params.mi_step;
    const int y_idx = (idx >> 1) * blk_params.mi_step;

    if (mi_row + y_idx >= mi_params->mi_rows ||
        mi_col + x_idx >= mi_params->mi_cols)
      continue;

    pc_tree->split[idx]->index = idx;
    int64_t *p_split_rd = &part_search_state->split_rd[idx];
    RD_STATS best_remain_rdcost;
    av1_rd_stats_subtraction(x->rdmult, best_rdc, &sum_rdc,
                             &best_remain_rdcost);

    int curr_quad_tree_idx = 0;
    if (frame_is_intra_only(cm) && bsize <= BLOCK_64X64) {
      curr_quad_tree_idx = part_search_state->intra_part_info->quad_tree_idx;
      part_search_state->intra_part_info->quad_tree_idx =
          4 * curr_quad_tree_idx + idx + 1;
    }
    // Split partition evaluation of corresponding idx.
    // If the RD cost exceeds the best cost then do not
    // evaluate other split sub-partitions.
    SIMPLE_MOTION_DATA_TREE *const sms_tree_split =
        (sms_tree == NULL) ? NULL : sms_tree->split[idx];
    if (!av1_rd_pick_partition(
            cpi, td, tile_data, tp, mi_row + y_idx, mi_col + x_idx, subsize,
            &part_search_state->this_rdc, best_remain_rdcost,
            pc_tree->split[idx], sms_tree_split, p_split_rd, multi_pass_mode,
            &part_search_state->split_part_rect_win[idx])) {
      av1_invalid_rd_stats(&sum_rdc);
      break;
    }
    if (frame_is_intra_only(cm) && bsize <= BLOCK_64X64) {
      part_search_state->intra_part_info->quad_tree_idx = curr_quad_tree_idx;
    }

    sum_rdc.rate += part_search_state->this_rdc.rate;
    sum_rdc.dist += part_search_state->this_rdc.dist;
    av1_rd_cost_update(x->rdmult, &sum_rdc);

    // Set split ctx as ready for use.
    if (idx <= 1 && (bsize <= BLOCK_8X8 ||
                     pc_tree->split[idx]->partitioning == PARTITION_NONE)) {
      const MB_MODE_INFO *const mbmi = &pc_tree->split[idx]->none->mic;
      const PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
      // Neither palette mode nor cfl predicted.
      if (pmi->palette_size[0] == 0 && pmi->palette_size[1] == 0) {
        if (mbmi->uv_mode != UV_CFL_PRED)
          part_search_state->is_split_ctx_is_ready[idx] = 1;
      }
    }
  }
#if CONFIG_COLLECT_PARTITION_STATS
  if (part_timing_stats->timer_is_on) {
    end_partition_block_timer(part_timing_stats, PARTITION_SPLIT,
                              sum_rdc.rdcost);
  }
#endif
  const int reached_last_index = (idx == SUB_PARTITIONS_SPLIT);

  // Calculate the total cost and update the best partition.
  *part_split_rd = sum_rdc.rdcost;
  if (reached_last_index && sum_rdc.rdcost < best_rdc->rdcost) {
    sum_rdc.rdcost = RDCOST(x->rdmult, sum_rdc.rate, sum_rdc.dist);
    if (sum_rdc.rdcost < best_rdc->rdcost) {
      *best_rdc = sum_rdc;
      part_search_state->found_best_partition = true;
      pc_tree->partitioning = PARTITION_SPLIT;
    }
  } else if (cpi->sf.part_sf.less_rectangular_check_level > 0) {
    // Skip rectangular partition test when partition type none gives better
    // rd than partition type split.
    if (cpi->sf.part_sf.less_rectangular_check_level == 2 || idx <= 2) {
      const int partition_none_valid = part_search_state->none_rd > 0;
      const int partition_none_better =
          part_search_state->none_rd < sum_rdc.rdcost;
      part_search_state->do_rectangular_split &=
          !(partition_none_valid && partition_none_better);
    }
  }
  // Restore the context for the following cases:
  // 1) Current block size not more than maximum partition size as dry run
  // encode happens for these cases
  // 2) Current block size same as superblock size as the final encode
  // happens for this case
  if (bsize <= x->sb_enc.max_partition_size || bsize == cm->seq_params->sb_size)
    av1_restore_context(x, x_ctx, mi_row, mi_col, bsize, av1_num_planes(cm));
}